

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O2

void __thiscall rlottie::internal::model::Trim::Trim(Trim *this)

{
  (this->super_Object).field_0.mPtr = (char *)0x0;
  (this->super_Object).field_0.mData._type = Trim;
  *(byte *)((long)&(this->super_Object).field_0 + 0xf) =
       *(byte *)((long)&(this->super_Object).field_0 + 0xf) & 0xf8 | 5;
  (this->mStart).isValue_ = true;
  (this->mStart).impl_.value_ = 0.0;
  (this->mEnd).isValue_ = true;
  (this->mEnd).impl_.value_ = 0.0;
  (this->mOffset).isValue_ = true;
  (this->mOffset).impl_.value_ = 0.0;
  this->mTrimType = Simultaneously;
  return;
}

Assistant:

explicit Object(Object::Type type) : mPtr(nullptr)
    {
        mData._type = type;
        mData._static = true;
        mData._shortString = true;
        mData._hidden = false;
    }